

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readdata.cpp
# Opt level: O0

int __thiscall ReadData::ReadHead(ReadData *this,BUFF *socketdata,uchar *buff)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  int local_30;
  uchar local_2b;
  uchar local_2a;
  int i;
  uchar HeadFlag [3];
  uchar *buff_local;
  BUFF *socketdata_local;
  ReadData *this_local;
  
  local_30 = socketdata->pos;
  while( true ) {
    if (socketdata->len <= local_30) {
      return 0;
    }
    lVar6 = (long)local_30;
    if (((local_2b == 0xaa) && (local_2a == 'D')) && (socketdata->buff[lVar6] == '\x12')) break;
    local_2b = local_2a;
    local_30 = local_30 + 1;
    local_2a = socketdata->buff[lVar6];
  }
  uVar1 = *(undefined8 *)(socketdata->buff + (long)local_30 + 1);
  uVar2 = *(undefined8 *)(socketdata->buff + (long)local_30 + 1 + 8);
  uVar3 = *(undefined8 *)(socketdata->buff + (long)local_30 + 10 + 8);
  *(undefined8 *)(buff + 9) = *(undefined8 *)(socketdata->buff + (long)local_30 + 10);
  *(undefined8 *)(buff + 0x11) = uVar3;
  *(undefined8 *)buff = uVar1;
  *(undefined8 *)(buff + 8) = uVar2;
  iVar4 = U2I(buff + 1,2);
  (this->Head).MessageID = iVar4;
  iVar4 = U2I(buff + 5,2);
  (this->Head).MessageLength = iVar4;
  iVar4 = U2I(buff + 10,1);
  (this->Head).TimeStatus = iVar4;
  if ((this->Head).MessageID == 0x2b) {
    iVar4 = U2I(buff + 0xb,2);
    (this->Head).GPST.Week = iVar4;
    iVar4 = U2I(buff + 0xd,4);
    (this->Head).GPST.SOW = (double)iVar4 / 1000.0;
  }
  uVar5 = U2I(buff + 0x11,4);
  (this->Head).HealthFlag = uVar5 & 1;
  socketdata->pos = local_30 + 0x1a + socketdata->pos;
  return 0;
}

Assistant:

int ReadData::ReadHead(BUFF &socketdata, unsigned char* buff) {
    unsigned char HeadFlag[3];
    for(int i = socketdata.pos; i < socketdata.len; ++i) {
        HeadFlag[2] = socketdata.buff[i];
        if(HeadFlag[0] != 0xaa || HeadFlag[1] != 0x44 || HeadFlag[2] != 0x12)
        {
            HeadFlag[0] = HeadFlag[1];
            HeadFlag[1] = HeadFlag[2];
            continue;
        }        
        memcpy(buff, socketdata.buff + i + 1, 25);

        try
        {
            this->Head.MessageID = U2I((buff + 1), 2);
            this->Head.MessageLength = U2I((buff + 5), 2);
            this->Head.TimeStatus = U2I((buff + 10), 1);
            if(this->Head.MessageID == 43)
            {
                this->Head.GPST.Week = U2I((buff + 11), 2);
                this->Head.GPST.SOW = U2I((buff + 13), 4) / 1000.0;
            }
            this->Head.HealthFlag = (U2I((buff + 17), 4) & 1);
            socketdata.pos += i + 25 + 1;
        }
        catch(...)
        {
            cout << "error happened when reading head" << endl;
            return UNKNOWN_ERROR;
        }
        break;
    }
    return 0;
}